

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O0

void __thiscall SQNativeClosure::Release(SQNativeClosure *this)

{
  SQObjectPtr *in_RDI;
  SQInteger nl;
  SQInteger size;
  SQUnsignedInteger in_stack_ffffffffffffffd8;
  long local_18;
  
  for (local_18 = 0; local_18 < in_RDI[5].super_SQObject._unVal.nInteger; local_18 = local_18 + 1) {
    ::SQObjectPtr::~SQObjectPtr(in_RDI);
  }
  (*(code *)**(undefined8 **)&in_RDI->super_SQObject)();
  sq_free(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void Release(){
        SQInteger size = _CALC_NATVIVECLOSURE_SIZE(_noutervalues);
        _DESTRUCT_VECTOR(SQObjectPtr,_noutervalues,_outervalues);
        this->~SQNativeClosure();
        sq_free(this,size);
    }